

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  SpectrumHandle SVar1;
  bool bVar2;
  int iVar3;
  uintptr_t iptr;
  RGBSpectrum *pRVar4;
  undefined4 extraout_var;
  HomogeneousMedium *pHVar5;
  Float FVar6;
  Float sigScale;
  Allocator alloc_local;
  allocator<char> local_a1;
  undefined1 local_a0 [32];
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  Float g;
  SpectrumHandle Le;
  string preset;
  undefined8 local_28;
  undefined8 local_20;
  size_t local_18;
  
  sig_a.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  sig_s.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"preset",(allocator<char> *)&sigScale);
  std::__cxx11::string::string<std::allocator<char>>((string *)&Le,"",(allocator<char> *)&g);
  ParameterDictionary::GetOneString(&preset,parameters,(string *)local_a0,(string *)&Le);
  std::__cxx11::string::~string((string *)&Le);
  std::__cxx11::string::~string((string *)local_a0);
  if (preset._M_string_length != 0) {
    bVar2 = GetMediumScatteringProperties(&preset,&sig_a,&sig_s,alloc_local);
    if (!bVar2) {
      Warning<std::__cxx11::string&>(loc,"Material preset \"%s\" not found.",&preset);
    }
  }
  if (sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"sigma_a",(allocator<char> *)&sigScale);
    local_18 = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)local_a0,
               (SpectrumType)&local_18,(Allocator)0x1);
    SVar1 = Le;
    sig_a = Le;
    std::__cxx11::string::~string((string *)local_a0);
    if (SVar1.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      local_a0._0_8_ = (pointer)0x3b1d49523a902de0;
      local_a0._8_4_ = 0.014;
      pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                         (&alloc_local,RGBColorSpace::sRGB,(RGB *)local_a0);
      sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)pRVar4 | 0x4000000000000);
    }
  }
  if (sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"sigma_s",(allocator<char> *)&sigScale);
    local_20 = (ParsedParameter *)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)local_a0,
               (SpectrumType)&local_20,(Allocator)0x1);
    SVar1 = Le;
    sig_s = Le;
    std::__cxx11::string::~string((string *)local_a0);
    if (SVar1.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      local_a0._0_8_ = (pointer)0x404d70a440233333;
      local_a0._8_4_ = 3.77;
      pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                         (&alloc_local,RGBColorSpace::sRGB,(RGB *)local_a0);
      sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)pRVar4 | 0x4000000000000);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"Le",(allocator<char> *)&sigScale);
  local_28 = (ParsedParameter *)0x0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)local_a0,
             (SpectrumType)&local_28,(Allocator)0x1);
  std::__cxx11::string::~string((string *)local_a0);
  if (Le.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    iVar3 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])(alloc_local.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0;
    Le.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(CONCAT44(extraout_var,iVar3) | 0x1000000000000);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"scale",(allocator<char> *)&g);
  FVar6 = ParameterDictionary::GetOneFloat(parameters,(string *)local_a0,1.0);
  std::__cxx11::string::~string((string *)local_a0);
  sigScale = FVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"g",&local_a1);
  FVar6 = ParameterDictionary::GetOneFloat(parameters,(string *)local_a0,0.0);
  std::__cxx11::string::~string((string *)local_a0);
  g = FVar6;
  pHVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HomogeneousMedium,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&sig_a,&sig_s,&sigScale,&Le,&g,&alloc_local);
  std::__cxx11::string::~string((string *)&preset);
  return pHVar5;
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(.0011f, .0024f, .014f));
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(2.55f, 3.21f, 3.77f));
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::General, alloc);
    if (Le == nullptr)
        Le = alloc.new_object<ConstantSpectrum>(0.f);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);

    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, g, alloc);
}